

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O3

void keymap_free(void)

{
  keymap *pkVar1;
  keymap *p;
  bool bVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    p = keymaps[lVar3];
    while (p != (keymap *)0x0) {
      pkVar1 = p->next;
      mem_free(p->actions);
      mem_free(p);
      p = pkVar1;
    }
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void keymap_free(void)
{
	size_t i;
	struct keymap *k;
	for (i = 0; i < N_ELEMENTS(keymaps); i++) {
		k = keymaps[i];
		while (k) {
			struct keymap *next = k->next;
			mem_free(k->actions);
			mem_free(k);
			k = next;
		}
	}
}